

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O2

void __thiscall FileSystemWatcher::clear(FileSystemWatcher *this)

{
  _Base_ptr p_Var1;
  
  std::mutex::lock(&this->mMutex);
  for (p_Var1 = (this->mWatchedByPath).
                super_map<Path,_int,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>.
                _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->mWatchedByPath).
       super_map<Path,_int,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>._M_t.
       _M_impl.super__Rb_tree_header; p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    inotify_rm_watch(this->mFd,p_Var1[2]._M_color);
  }
  std::
  _Rb_tree<Path,_std::pair<const_Path,_int>,_std::_Select1st<std::pair<const_Path,_int>_>,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>
  ::clear((_Rb_tree<Path,_std::pair<const_Path,_int>,_std::_Select1st<std::pair<const_Path,_int>_>,_std::less<Path>,_std::allocator<std::pair<const_Path,_int>_>_>
           *)&this->mWatchedByPath);
  std::
  _Rb_tree<int,_std::pair<const_int,_Path>,_std::_Select1st<std::pair<const_int,_Path>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_Path>,_std::_Select1st<std::pair<const_int,_Path>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Path>_>_>
           *)&this->mWatchedById);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return;
}

Assistant:

void FileSystemWatcher::clear()
{
    std::lock_guard<std::mutex> lock(mMutex);
    for (Map<Path, int>::const_iterator it = mWatchedByPath.begin(); it != mWatchedByPath.end(); ++it) {
        inotify_rm_watch(mFd, it->second);
    }
    mWatchedByPath.clear();
    mWatchedById.clear();
}